

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O1

SUNErrCode SUNDataNode_HasChildren_InMem(SUNDataNode self,int *yes_or_no)

{
  long *plVar1;
  uint uVar2;
  
  plVar1 = *(long **)((long)self->content + 0x30);
  if ((plVar1 == (long *)0x0) || (uVar2 = 1, *plVar1 == 0)) {
    uVar2 = (uint)(*(long *)((long)self->content + 0x28) != 0);
  }
  *yes_or_no = uVar2;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_HasChildren_InMem(const SUNDataNode self,
                                         sunbooleantype* yes_or_no)
{
  SUNFunctionBegin(self->sunctx);
  *yes_or_no =
    (IMPL_MEMBER(self, anon_children) &&
     SUNStlVector_SUNDataNode_Size(IMPL_MEMBER(self, anon_children)) != 0) ||
    IMPL_MEMBER(self, num_named_children) != 0;
  return SUN_SUCCESS;
}